

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O3

void __thiscall
duckdb::BoxRenderer::RenderRowCount
          (BoxRenderer *this,string *row_count_str,string *shown_str,string *column_count_str,
          vector<unsigned_long,_true> *boundaries,bool has_hidden_rows,bool has_hidden_columns,
          idx_t total_length,idx_t row_count,idx_t column_count,idx_t minimum_row_length,
          BaseResultRenderer *ss)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BoxRenderer *pBVar2;
  ulong uVar3;
  const_reference pvVar4;
  byte bVar5;
  size_type sVar6;
  undefined7 in_register_00000089;
  size_type __n;
  long lVar7;
  uint uVar8;
  idx_t unaff_R15;
  undefined7 uVar10;
  value_type vVar9;
  allocator local_7b;
  byte local_7a;
  bool local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  BoxRenderer *local_58;
  string *local_50;
  undefined4 local_48;
  uint local_44;
  string *local_40;
  string *local_38;
  
  sVar6 = row_count_str->_M_string_length;
  local_58 = this;
  local_50 = shown_str;
  if ((int)CONCAT71(in_register_00000089,has_hidden_rows) == 0) {
    local_48 = 0;
  }
  else {
    local_48 = (undefined4)CONCAT71((int7)((ulong)shown_str >> 8),1);
    if (shown_str->_M_string_length + sVar6 + 5 <= total_length) {
      ::std::operator+(&local_78," ",shown_str);
      ::std::__cxx11::string::_M_append((char *)row_count_str,(ulong)local_78._M_dataplus._M_p);
      paVar1 = &local_78.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::operator=((string *)local_50,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      sVar6 = row_count_str->_M_string_length;
      minimum_row_length = sVar6 + 4;
      local_48 = 0;
      unaff_R15 = total_length;
    }
  }
  if (total_length < sVar6 + column_count_str->_M_string_length + 6) {
    uVar3 = 0;
LAB_00374948:
    uVar8 = (uint)uVar3;
    local_79 = row_count - 10 < 0xfffffffffffffff7 && minimum_row_length <= total_length;
    bVar5 = local_79 | (byte)uVar3;
    pBVar2 = local_58;
    if (row_count != 0) {
      uVar3 = (ulong)bVar5 << 5 | 0x58;
      local_7a = bVar5;
      goto LAB_00374979;
    }
  }
  else {
    uVar10 = (undefined7)(unaff_R15 >> 8);
    if (!has_hidden_columns || row_count == 0) {
      uVar3 = CONCAT71(uVar10,1 < column_count && 9 < row_count);
      goto LAB_00374948;
    }
    local_79 = row_count - 10 < 0xfffffffffffffff7 && minimum_row_length <= total_length;
    uVar8 = (uint)CONCAT71(uVar10,1);
    uVar3 = 0x78;
    local_7a = 1;
LAB_00374979:
    ::std::__cxx11::string::string
              ((string *)&local_78,*(char **)((long)&(local_58->config).max_width + uVar3),&local_7b
              );
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    local_44 = uVar8;
    local_40 = row_count_str;
    local_38 = column_count_str;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (total_length != 2) {
      vVar9 = 0;
      __n = 0;
      do {
        uVar3 = __n + 1;
        if ((uVar3 < (ulong)((long)(boundaries->
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(boundaries->
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3)) &&
           (pvVar4 = vector<unsigned_long,_true>::operator[](boundaries,__n), vVar9 == *pvVar4)) {
          ::std::__cxx11::string::string((string *)&local_78,(local_58->config).DMIDDLE,&local_7b);
          (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
        }
        else {
          ::std::__cxx11::string::string
                    ((string *)&local_78,(local_58->config).HORIZONTAL,&local_7b);
          (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
          uVar3 = __n;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p);
          }
        }
        vVar9 = vVar9 + 1;
        __n = uVar3;
      } while (total_length - 2 != vVar9);
    }
    ::std::__cxx11::string::string
              ((string *)&local_78,(&(local_58->config).RDCORNER)[(ulong)local_7a * 4],&local_7b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    column_count_str = local_38;
    row_count_str = local_40;
    uVar3 = (ulong)local_44;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    BaseResultRenderer::operator<<(ss,'\n');
    pBVar2 = local_58;
    bVar5 = local_7a;
  }
  if (bVar5 == 0) {
    return;
  }
  local_58 = pBVar2;
  if ((char)uVar3 == '\0') {
    if (local_79 == false) goto LAB_00374d4d;
    RenderValue(pBVar2,ss,row_count_str,total_length - 4,FOOTER,MIDDLE);
    ::std::__cxx11::string::string((string *)&local_78,(pBVar2->config).VERTICAL,&local_7b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    BaseResultRenderer::operator<<(ss,'\n');
    pBVar2 = local_58;
    if ((char)local_48 == '\0') goto LAB_00374d4d;
    RenderValue(local_58,ss,local_50,total_length - 4,FOOTER,MIDDLE);
    ::std::__cxx11::string::string((string *)&local_78,(pBVar2->config).VERTICAL,&local_7b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_00374c50;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_78,(pBVar2->config).VERTICAL,&local_7b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    paVar1 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    local_78._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," ","");
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    (*ss->_vptr_BaseResultRenderer[7])(ss,row_count_str);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct
              ((ulong)&local_78,
               ((char)total_length -
               ((char)row_count_str->_M_string_length + (char)column_count_str->_M_string_length)) +
               -4);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    (*ss->_vptr_BaseResultRenderer[7])(ss,column_count_str);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," ","");
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    ::std::__cxx11::string::string((string *)&local_78,(local_58->config).VERTICAL,&local_7b);
    (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
LAB_00374c50:
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  BaseResultRenderer::operator<<(ss,'\n');
LAB_00374d4d:
  ::std::__cxx11::string::string((string *)&local_78,(local_58->config).LDCORNER,&local_7b);
  (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  lVar7 = total_length - 2;
  if (lVar7 != 0) {
    do {
      ::std::__cxx11::string::string((string *)&local_78,(local_58->config).HORIZONTAL,&local_7b);
      (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  ::std::__cxx11::string::string((string *)&local_78,(local_58->config).RDCORNER,&local_7b);
  (*ss->_vptr_BaseResultRenderer[2])(ss,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  BaseResultRenderer::operator<<(ss,'\n');
  return;
}

Assistant:

void BoxRenderer::RenderRowCount(string row_count_str, string shown_str, const string &column_count_str,
                                 const vector<idx_t> &boundaries, bool has_hidden_rows, bool has_hidden_columns,
                                 idx_t total_length, idx_t row_count, idx_t column_count, idx_t minimum_row_length,
                                 BaseResultRenderer &ss) {
	// check if we can merge the row_count_str and the shown_str
	bool display_shown_separately = has_hidden_rows;
	if (has_hidden_rows && total_length >= row_count_str.size() + shown_str.size() + 5) {
		// we can!
		row_count_str += " " + shown_str;
		shown_str = string();
		display_shown_separately = false;
		minimum_row_length = row_count_str.size() + 4;
	}
	auto minimum_length = row_count_str.size() + column_count_str.size() + 6;
	bool render_rows_and_columns = total_length >= minimum_length &&
	                               ((has_hidden_columns && row_count > 0) || (row_count >= 10 && column_count > 1));
	bool render_rows = total_length >= minimum_row_length && (row_count == 0 || row_count >= 10);
	bool render_anything = true;
	if (!render_rows && !render_rows_and_columns) {
		render_anything = false;
	}
	// render the bottom of the result values, if there are any
	if (row_count > 0) {
		ss << (render_anything ? config.LMIDDLE : config.LDCORNER);
		idx_t column_index = 0;
		for (idx_t k = 0; k < total_length - 2; k++) {
			if (column_index + 1 < boundaries.size() && k == boundaries[column_index]) {
				ss << config.DMIDDLE;
				column_index++;
			} else {
				ss << config.HORIZONTAL;
			}
		}
		ss << (render_anything ? config.RMIDDLE : config.RDCORNER);
		ss << '\n';
	}
	if (!render_anything) {
		return;
	}

	if (render_rows_and_columns) {
		ss << config.VERTICAL;
		ss << " ";
		ss.Render(ResultRenderType::FOOTER, row_count_str);
		ss << string(total_length - row_count_str.size() - column_count_str.size() - 4, ' ');
		ss.Render(ResultRenderType::FOOTER, column_count_str);
		ss << " ";
		ss << config.VERTICAL;
		ss << '\n';
	} else if (render_rows) {
		RenderValue(ss, row_count_str, total_length - 4, ResultRenderType::FOOTER);
		ss << config.VERTICAL;
		ss << '\n';

		if (display_shown_separately) {
			RenderValue(ss, shown_str, total_length - 4, ResultRenderType::FOOTER);
			ss << config.VERTICAL;
			ss << '\n';
		}
	}
	// render the bottom line
	ss << config.LDCORNER;
	for (idx_t k = 0; k < total_length - 2; k++) {
		ss << config.HORIZONTAL;
	}
	ss << config.RDCORNER;
	ss << '\n';
}